

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::ImageCopyFromImage::submit
          (ImageCopyFromImage *this,SubmitContext *context)

{
  deUint64 dVar1;
  Context *this_00;
  DeviceInterface *pDVar2;
  VkCommandBuffer pVVar3;
  Handle<(vk::HandleType)9> *pHVar4;
  VkImage VVar5;
  undefined4 local_6c;
  undefined4 local_68;
  VkImageCopy region;
  VkCommandBuffer commandBuffer;
  DeviceInterface *vkd;
  SubmitContext *context_local;
  ImageCopyFromImage *this_local;
  
  this_00 = SubmitContext::getContext(context);
  pDVar2 = Context::getDeviceInterface(this_00);
  pVVar3 = SubmitContext::getCommandBuffer(context);
  local_6c = 1;
  local_68 = 0;
  region.srcSubresource.aspectMask = 0;
  region.srcSubresource.mipLevel = 1;
  region.srcSubresource.baseArrayLayer = 0;
  region.srcSubresource.layerCount = 0;
  region.srcOffset.x = 0;
  region.srcOffset.y = 1;
  region.srcOffset.z = 0;
  region.dstSubresource.aspectMask = 0;
  region.dstSubresource.mipLevel = 1;
  region.dstSubresource.baseArrayLayer = 0;
  region.dstSubresource.layerCount = 0;
  region.dstOffset.x = 0;
  region.dstOffset.y = this->m_imageWidth;
  region.dstOffset.z = this->m_imageHeight;
  region.extent.width = 1;
  region.extent._4_8_ = pVVar3;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  dVar1 = pHVar4->m_internal;
  VVar5 = SubmitContext::getImage(context);
  (*pDVar2->_vptr_DeviceInterface[0x60])
            (pDVar2,pVVar3,dVar1,6,VVar5.m_internal,(ulong)this->m_imageLayout,1,&local_6c);
  return;
}

Assistant:

void ImageCopyFromImage::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd				= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	commandBuffer	= context.getCommandBuffer();
	const vk::VkImageCopy		region			=
	{
		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0,	// mipLevel
			0,	// arrayLayer
			1	// layerCount
		},
		{ 0, 0, 0 },

		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0,	// mipLevel
			0,	// arrayLayer
			1	// layerCount
		},
		{ 0, 0, 0 },
		{
			(deUint32)m_imageWidth,
			(deUint32)m_imageHeight,
			1u
		}
	};

	vkd.cmdCopyImage(commandBuffer, *m_srcImage, vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, context.getImage(), m_imageLayout, 1, &region);
}